

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlReadMemory(char *buffer,int size,char *URL,char *encoding,int options)

{
  htmlParserCtxtPtr ctxt_00;
  htmlParserCtxtPtr ctxt;
  int options_local;
  char *encoding_local;
  char *URL_local;
  int size_local;
  char *buffer_local;
  
  xmlInitParser();
  ctxt_00 = htmlCreateMemoryParserCtxt(buffer,size);
  if (ctxt_00 == (htmlParserCtxtPtr)0x0) {
    buffer_local = (char *)0x0;
  }
  else {
    buffer_local = (char *)htmlDoRead(ctxt_00,URL,encoding,options,0);
  }
  return (htmlDocPtr)buffer_local;
}

Assistant:

htmlDocPtr
htmlReadMemory(const char *buffer, int size, const char *URL, const char *encoding, int options)
{
    htmlParserCtxtPtr ctxt;

    xmlInitParser();
    ctxt = htmlCreateMemoryParserCtxt(buffer, size);
    if (ctxt == NULL)
        return (NULL);
    return (htmlDoRead(ctxt, URL, encoding, options, 0));
}